

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit_state.cpp
# Opt level: O1

void __thiscall
duckdb::CommitState::CommitEntryDrop(CommitState *this,CatalogEntry *entry,data_ptr_t dataptr)

{
  CatalogType CVar1;
  uint uVar2;
  int iVar3;
  CatalogEntry *pCVar4;
  ulong uVar5;
  InternalException *pIVar6;
  DuckTableEntry *table_entry;
  _func_int **pp_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_name;
  MemoryStream source;
  BinaryDeserializer deserializer;
  undefined1 local_328 [32];
  string local_308;
  MemoryStream local_2e8;
  BinaryDeserializer local_2b8;
  
  if ((entry->temporary == false) &&
     (pCVar4 = CatalogEntry::Parent(entry), pCVar4->temporary == false)) {
    pCVar4 = CatalogEntry::Parent(entry);
    CVar1 = pCVar4->type;
    uVar5 = (ulong)CVar1;
    uVar2 = (uint)CVar1;
    if (uVar5 < 0x35) {
      if ((0x1000003e0002a4U >> (uVar5 & 0x3f) & 1) != 0) {
        return;
      }
      if ((0xc000015aUL >> (uVar5 & 0x3f) & 1) != 0) {
        if ((entry->type != RENAMED_ENTRY) && (entry->type != CVar1)) {
          if ((uVar2 < 0x20) && ((0xc000015aU >> (uVar2 & 0x1f) & 1) != 0)) {
            return;
          }
          pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
          local_2b8.super_Deserializer._vptr_Deserializer =
               (_func_int **)&local_2b8.super_Deserializer.data;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b8,"Don\'t know how to create this type!","");
          InternalException::InternalException(pIVar6,(string *)&local_2b8);
          __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        MemoryStream::MemoryStream(&local_2e8,dataptr + 8,*(idx_t *)dataptr);
        local_2b8.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_0247c408;
        local_2b8.super_Deserializer.deserialize_enum_from_string = false;
        SerializationData::SerializationData(&local_2b8.super_Deserializer.data);
        local_2b8.stream = &local_2e8.super_ReadStream;
        local_2b8.super_Deserializer._vptr_Deserializer = (_func_int **)&PTR__Deserializer_02490d70;
        local_2b8.nesting_level = 0;
        local_2b8.has_buffered_field = false;
        local_2b8.buffered_field = 0;
        local_2b8.super_Deserializer.deserialize_enum_from_string = false;
        BinaryDeserializer::OnObjectBegin(&local_2b8);
        (*local_2b8.super_Deserializer._vptr_Deserializer[2])(&local_2b8,100,"column_name");
        (*local_2b8.super_Deserializer._vptr_Deserializer[0x1a])(&local_308);
        (*local_2b8.super_Deserializer._vptr_Deserializer[3])();
        (*local_2b8.super_Deserializer._vptr_Deserializer[2])(&local_2b8,0x65,"alter_info");
        iVar3 = (*local_2b8.super_Deserializer._vptr_Deserializer[10])();
        if ((char)iVar3 == '\0') {
          pp_Var7 = (_func_int **)0x0;
        }
        else {
          (*local_2b8.super_Deserializer._vptr_Deserializer[6])();
          ParseInfo::Deserialize((ParseInfo *)local_328,&local_2b8.super_Deserializer);
          (*local_2b8.super_Deserializer._vptr_Deserializer[7])();
          pp_Var7 = (_func_int **)local_328._0_8_;
        }
        (*local_2b8.super_Deserializer._vptr_Deserializer[0xb])();
        (*local_2b8.super_Deserializer._vptr_Deserializer[3])();
        BinaryDeserializer::OnObjectEnd(&local_2b8);
        CVar1 = pCVar4->type;
        if (CVar1 < 0x20) {
          if ((0xc0000158U >> (CVar1 & 0x1f) & 1) == 0) {
            if (CVar1 != TABLE_ENTRY) goto LAB_01810211;
            if (local_308._M_string_length != 0) {
              DuckTableEntry::CommitAlter((DuckTableEntry *)entry,&local_308);
            }
          }
          if (pp_Var7 != (_func_int **)0x0) {
            (**(code **)(*pp_Var7 + 8))(pp_Var7);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          Deserializer::~Deserializer(&local_2b8.super_Deserializer);
          MemoryStream::~MemoryStream(&local_2e8);
          return;
        }
LAB_01810211:
        pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
        local_328._0_8_ = local_328 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,"Don\'t know how to alter this type!","");
        InternalException::InternalException(pIVar6,(string *)local_328);
        __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (uVar5 == 0x33) {
        if (entry->type == INDEX_ENTRY) {
          DuckIndexEntry::CommitDrop((DuckIndexEntry *)entry);
          return;
        }
        if (entry->type != TABLE_ENTRY) {
          return;
        }
        DuckTableEntry::CommitDrop((DuckTableEntry *)entry);
        return;
      }
    }
    if ((0x1d < uVar2 - 0x47) || ((0x20000007U >> (uVar2 - 0x47 & 0x1f) & 1) == 0)) {
      pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
      local_2b8.super_Deserializer._vptr_Deserializer =
           (_func_int **)&local_2b8.super_Deserializer.data;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,"UndoBuffer - don\'t know how to write this entry to the WAL",
                 "");
      InternalException::InternalException(pIVar6,(string *)&local_2b8);
      __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void CommitState::CommitEntryDrop(CatalogEntry &entry, data_ptr_t dataptr) {
	if (entry.temporary || entry.Parent().temporary) {
		return;
	}

	// look at the type of the parent entry
	auto &parent = entry.Parent();

	switch (parent.type) {
	case CatalogType::TABLE_ENTRY:
	case CatalogType::VIEW_ENTRY:
	case CatalogType::INDEX_ENTRY:
	case CatalogType::SEQUENCE_ENTRY:
	case CatalogType::TYPE_ENTRY:
	case CatalogType::MACRO_ENTRY:
	case CatalogType::TABLE_MACRO_ENTRY:
		if (entry.type == CatalogType::RENAMED_ENTRY || entry.type == parent.type) {
			// ALTER statement, read the extra data after the entry
			auto extra_data_size = Load<idx_t>(dataptr);
			auto extra_data = data_ptr_cast(dataptr + sizeof(idx_t));

			MemoryStream source(extra_data, extra_data_size);
			BinaryDeserializer deserializer(source);
			deserializer.Begin();
			auto column_name = deserializer.ReadProperty<string>(100, "column_name");
			auto parse_info = deserializer.ReadProperty<unique_ptr<ParseInfo>>(101, "alter_info");
			deserializer.End();

			switch (parent.type) {
			case CatalogType::TABLE_ENTRY:
				if (!column_name.empty()) {
					D_ASSERT(entry.type != CatalogType::RENAMED_ENTRY);
					auto &table_entry = entry.Cast<DuckTableEntry>();
					D_ASSERT(table_entry.IsDuckTable());
					// write the alter table in the log
					table_entry.CommitAlter(column_name);
				}
				break;
			case CatalogType::VIEW_ENTRY:
			case CatalogType::INDEX_ENTRY:
			case CatalogType::SEQUENCE_ENTRY:
			case CatalogType::TYPE_ENTRY:
			case CatalogType::MACRO_ENTRY:
			case CatalogType::TABLE_MACRO_ENTRY:
				(void)column_name;
				break;
			default:
				throw InternalException("Don't know how to alter this type!");
			}
		} else {
			switch (parent.type) {
			case CatalogType::TABLE_ENTRY:
			case CatalogType::VIEW_ENTRY:
			case CatalogType::INDEX_ENTRY:
			case CatalogType::SEQUENCE_ENTRY:
			case CatalogType::TYPE_ENTRY:
			case CatalogType::MACRO_ENTRY:
			case CatalogType::TABLE_MACRO_ENTRY:
				break;
			default:
				throw InternalException("Don't know how to create this type!");
			}
		}
		break;
	case CatalogType::SCHEMA_ENTRY:
		break;
	case CatalogType::RENAMED_ENTRY:
		// This is a rename, nothing needs to be done for this
		break;
	case CatalogType::DELETED_ENTRY:
		switch (entry.type) {
		case CatalogType::TABLE_ENTRY: {
			auto &table_entry = entry.Cast<DuckTableEntry>();
			D_ASSERT(table_entry.IsDuckTable());

			// If the table was renamed, we do not need to drop the DataTable.
			table_entry.CommitDrop();
			break;
		}
		case CatalogType::INDEX_ENTRY: {
			auto &index_entry = entry.Cast<DuckIndexEntry>();
			index_entry.CommitDrop();
			break;
		}
		default:
			// no action required
			break;
		}
		break;
	case CatalogType::DATABASE_ENTRY:
	case CatalogType::PREPARED_STATEMENT:
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
	case CatalogType::SCALAR_FUNCTION_ENTRY:
	case CatalogType::TABLE_FUNCTION_ENTRY:
	case CatalogType::COPY_FUNCTION_ENTRY:
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
	case CatalogType::COLLATION_ENTRY:
	case CatalogType::DEPENDENCY_ENTRY:
	case CatalogType::SECRET_ENTRY:
	case CatalogType::SECRET_TYPE_ENTRY:
	case CatalogType::SECRET_FUNCTION_ENTRY:
		// do nothing, these entries are not persisted to disk
		break;
	default:
		throw InternalException("UndoBuffer - don't know how to write this entry to the WAL");
	}
}